

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::anon_unknown_0::PreservingSwapTest::init(PreservingSwapTest *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *this_00;
  ApiType apiType;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar1;
  Library *egl;
  EGLConfig pvVar2;
  NotSupportedError *this_01;
  GLES2Program *this_02;
  ReferenceProgram *this_03;
  PreservingSwapTest *this_local;
  
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar1 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  this->m_eglDisplay = pvVar1;
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar2 = getEGLConfig(egl,this->m_eglDisplay,(bool)(this->m_preserveColorbuffer & 1));
  this->m_eglConfig = pvVar2;
  if (this->m_eglConfig == (EGLConfig)0x0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"No supported config found",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
               ,0x169);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initEGLSurface(this,this->m_eglConfig);
  initEGLContext(this,this->m_eglConfig);
  this_00 = (this->super_TestCase).m_eglTestCtx;
  apiType = glu::ApiType::es(2,0);
  EglTestContext::initGLFunctions(this_00,&this->m_gl,apiType);
  this_02 = (GLES2Program *)operator_new(0xe0);
  GLES2Program::GLES2Program(this_02,&this->m_gl);
  this->m_gles2Program = this_02;
  this_03 = (ReferenceProgram *)operator_new(1);
  ReferenceProgram::ReferenceProgram(this_03);
  this->m_refProgram = this_03;
  return (int)this;
}

Assistant:

void PreservingSwapTest::init (void)
{
	m_eglDisplay	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig		= getEGLConfig(m_eglTestCtx.getLibrary(), m_eglDisplay, m_preserveColorbuffer);

	if (m_eglConfig == DE_NULL)
		TCU_THROW(NotSupportedError, "No supported config found");

	initEGLSurface(m_eglConfig);
	initEGLContext(m_eglConfig);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	m_gles2Program	= new GLES2Program(m_gl);
	m_refProgram	= new ReferenceProgram();
}